

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAux.h
# Opt level: O0

RefData * __thiscall BamTools::RefData::operator=(RefData *this,RefData *param_2)

{
  string *in_RSI;
  RefData *in_RDI;
  
  std::__cxx11::string::operator=((string *)in_RDI,in_RSI);
  in_RDI->RefLength = *(int32_t *)(in_RSI + 0x20);
  return in_RDI;
}

Assistant:

struct API_EXPORT RefData
{

    std::string RefName;  //!< name of reference sequence
    int32_t RefLength;    //!< length of reference sequence

    //! constructor
    RefData(const std::string& name = std::string(), const int32_t& length = 0)
        : RefName(name)
        , RefLength(length)
    {}
}